

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::CropString(string *__return_storage_ptr__,string *s,size_t max_len)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  string local_80 [32];
  string local_60 [32];
  ulong local_40;
  size_t middle;
  undefined1 local_21;
  ulong local_20;
  size_t max_len_local;
  string *s_local;
  string *n;
  
  local_20 = max_len;
  max_len_local = (size_t)s;
  s_local = __return_storage_ptr__;
  lVar3 = std::__cxx11::string::size();
  uVar1 = local_20;
  if (((lVar3 == 0) || (local_20 == 0)) || (uVar4 = std::__cxx11::string::size(), uVar4 <= uVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)max_len_local);
  }
  else {
    local_21 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    local_40 = local_20 >> 1;
    std::__cxx11::string::substr((ulong)local_60,max_len_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
    std::__cxx11::string::~string(local_60);
    sVar2 = max_len_local;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_80,sVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
    if (2 < local_20) {
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar5 = 0x2e;
      if (3 < local_20) {
        puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
        *puVar5 = 0x2e;
        if (4 < local_20) {
          puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
          *puVar5 = 0x2e;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::CropString(const kwsys_stl::string& s,
                                          size_t max_len)
{
  if (!s.size() || max_len == 0 || max_len >= s.size())
    {
    return s;
    }

  kwsys_stl::string n;
  n.reserve(max_len);

  size_t middle = max_len / 2;

  n += s.substr(0, middle);
  n += s.substr(s.size() - (max_len - middle), kwsys_stl::string::npos);

  if (max_len > 2)
    {
    n[middle] = '.';
    if (max_len > 3)
      {
      n[middle - 1] = '.';
      if (max_len > 4)
        {
        n[middle + 1] = '.';
        }
      }
    }

  return n;
}